

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O3

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *this,JitAllocatorBlock *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined7 uVar9;
  uint uVar10;
  JitAllocatorBlock *pJVar11;
  CpuInfo *pCVar12;
  JitAllocatorBlock *pJVar13;
  JitAllocatorBlock *pJVar14;
  JitAllocatorBlock *pJVar15;
  ulong uVar16;
  uint extraout_EDX;
  JitAllocatorBlock *pJVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  JitAllocatorBlock *pJVar21;
  ulong *puVar22;
  Environment EVar23;
  Environment this_00;
  ulong *puVar24;
  byte *pbVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  ZoneTreeNode *save;
  Environment *pEVar30;
  byte *pbVar31;
  ulong *puVar32;
  bool bVar33;
  ZoneTreeNode head;
  undefined8 uStack_a0;
  Environment EStack_98;
  ulong uStack_90;
  Environment *pEStack_88;
  JitAllocatorPool *pJStack_80;
  BitWord *local_40;
  JitAllocatorBlock *local_38;
  
  if (*(ulong *)node < 2) {
    if (*(long *)&node->field_0x8 != 0) goto LAB_00120c6c;
    if (*(ulong *)node == 0) {
      pJVar14 = *(JitAllocatorBlock **)this;
      if (pJVar14 == (JitAllocatorBlock *)0x0) {
        *(JitAllocatorBlock **)this = node;
      }
      else {
        pJVar11 = (JitAllocatorBlock *)&local_40;
        local_40 = (BitWord *)0x0;
        local_38 = pJVar14;
        *(undefined8 *)node = 1;
        pJVar17 = (JitAllocatorBlock *)0x0;
        pJVar15 = (JitAllocatorBlock *)0x0;
        uVar20 = 0;
        uVar28 = 0;
        while( true ) {
          uVar18 = uVar20;
          if (pJVar14 == (JitAllocatorBlock *)0x0) {
            *(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar18 * 8)
                 = (ulong)((uint)*(undefined8 *)
                                  (&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                  uVar18 * 8) & 1) | (ulong)node;
            pJVar13 = node;
          }
          else {
            pbVar25 = (byte *)((ulong)*(BitWord **)pJVar14 & 0xfffffffffffffffe);
            pJVar13 = pJVar14;
            if ((((pbVar25 != (byte *)0x0) && ((*pbVar25 & 1) != 0)) &&
                (*(byte **)&pJVar14->field_0x8 != (byte *)0x0)) &&
               ((**(byte **)&pJVar14->field_0x8 & 1) != 0)) {
              *(BitWord **)pJVar14 = (BitWord *)((ulong)*(BitWord **)pJVar14 | 1);
              *pbVar25 = *pbVar25 & 0xfe;
              **(ulong **)&pJVar14->field_0x8 = **(ulong **)&pJVar14->field_0x8 & 0xfffffffffffffffe
              ;
            }
          }
          if (((pJVar15 != (JitAllocatorBlock *)0x0) &&
              (((undefined1  [104])*pJVar13 & (undefined1  [104])0x1) != (undefined1  [104])0x0)) &&
             (((byte)pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) != 0)) {
            pJVar14 = *(JitAllocatorBlock **)&pJVar11->field_0x8;
            bVar33 = uVar28 == 0;
            uVar20 = (ulong)!bVar33;
            pbVar25 = (byte *)(*(ulong *)(&pJVar17->
                                           super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                         uVar20 * 8) & 0xfffffffffffffffe);
            pbVar31 = (byte *)(*(ulong *)(pbVar25 + (ulong)bVar33 * 8) & 0xfffffffffffffffe);
            if (pJVar13 ==
                (JitAllocatorBlock *)
                (*(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                           uVar28 * 8) & 0xfffffffffffffffe)) {
              puVar32 = (ulong *)(pbVar25 + (ulong)bVar33 * 8);
              uVar28 = (ulong)pbVar31 |
                       (ulong)((uint)*(ulong *)(&pJVar17->
                                                 super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                               + uVar20 * 8) & 1);
            }
            else {
              uVar29 = (uint)!bVar33 * 8;
              lVar27 = (ulong)bVar33 * 8;
              *(ulong *)(pbVar25 + lVar27) =
                   (ulong)((uint)*(ulong *)(pbVar25 + (ulong)bVar33 * 8) & 1) |
                   *(ulong *)(pbVar31 + uVar29) & 0xfffffffffffffffe;
              *(ulong *)(pbVar31 + uVar29) =
                   (ulong)((uint)*(undefined8 *)(pbVar31 + uVar29) & 1) | (ulong)pbVar25;
              *pbVar25 = *pbVar25 | 1;
              *pbVar31 = *pbVar31 & 0xfe;
              uVar28 = (ulong)((uint)*(undefined8 *)
                                      (&pJVar17->
                                        super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                      uVar29) & 1);
              *(ulong *)(&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar29) =
                   uVar28 | (ulong)pbVar31;
              puVar32 = (ulong *)(pbVar31 + lVar27);
              uVar28 = *(ulong *)(pbVar31 + lVar27) & 0xfffffffffffffffe | uVar28;
              pbVar25 = pbVar31;
            }
            *(ulong *)(&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8)
                 = uVar28;
            *puVar32 = (ulong)((uint)*puVar32 & 1) | (ulong)pJVar17;
            pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                 (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                 ((byte)pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
            uVar20 = (ulong)(pJVar17 == pJVar14);
            *pbVar25 = *pbVar25 & 0xfe;
            *(ulong *)(&pJVar11->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8)
                 = (ulong)((uint)*(undefined8 *)
                                  (&pJVar11->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                  uVar20 * 8) & 1) | (ulong)pbVar25;
          }
          if (pJVar13 == node) break;
          uVar20 = (ulong)((pJVar13->_mapping).rx < (node->_mapping).rx);
          if (pJVar17 != (JitAllocatorBlock *)0x0) {
            pJVar11 = pJVar17;
          }
          pJVar14 = (JitAllocatorBlock *)
                    (*(ulong *)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                               uVar20 * 8) & 0xfffffffffffffffe);
          pJVar17 = pJVar15;
          pJVar15 = pJVar13;
          uVar28 = uVar18;
        }
        *(JitAllocatorBlock **)this = local_38;
        local_38->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
             (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
             ((byte)local_38->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 0xfe);
      }
      return;
    }
  }
  else {
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_00120c6c:
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  EVar23 = (Environment)&uStack_a0;
  uStack_a0._0_1_ = (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)0x0;
  uStack_a0._1_7_ = 0;
  pEStack_88 = (Environment *)this;
  this_00 = *(Environment *)this;
  EStack_98 = this_00;
  if ((ulong)this_00 < 2) goto LAB_00120fe2;
  pEVar30 = &EStack_98;
  pvVar3 = (node->_mapping).rx;
  pJVar11 = (JitAllocatorBlock *)0x0;
  pJVar14 = (JitAllocatorBlock *)0x0;
  uVar20 = 1;
  pJVar17 = (JitAllocatorBlock *)0x0;
  pJVar15 = (JitAllocatorBlock *)&uStack_a0;
  do {
    pJVar13 = pJVar15;
    pJVar15 = (JitAllocatorBlock *)((ulong)this_00 & 0xfffffffffffffffe);
    pvVar4 = (pJVar15->_mapping).rx;
    uVar29 = (uint)(pvVar4 >= pvVar3 && pvVar4 != pvVar3) - (uint)(pvVar4 < pvVar3);
    uVar28 = (ulong)(uVar29 >> 0x1f);
    if (pJVar15 == node) {
      pJVar11 = pJVar15;
      pJVar14 = pJVar17;
    }
    if ((((byte)pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) == 0) &&
       ((pbVar25 = (byte *)(*(ulong *)(&pJVar15->
                                        super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                      uVar28 * 8) & 0xfffffffffffffffe), pbVar25 == (byte *)0x0 ||
        ((*pbVar25 & 1) == 0)))) {
      uVar18 = (ulong)(-1 < (int)uVar29);
      pJVar21 = (JitAllocatorBlock *)
                (*(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                           uVar18 * 8) & 0xfffffffffffffffe);
      if ((pJVar21 == (JitAllocatorBlock *)0x0) ||
         (((byte)pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) == 0)) {
        uVar18 = (ulong)(uVar20 == 0);
        puVar32 = (ulong *)(*(ulong *)(&pJVar13->
                                        super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                      uVar18 * 8) & 0xfffffffffffffffe);
        if (puVar32 != (ulong *)0x0) {
          pbVar25 = (byte *)(puVar32[uVar18] & 0xfffffffffffffffe);
          if ((pbVar25 == (byte *)0x0) || ((*pbVar25 & 1) == 0)) {
            pbVar31 = (byte *)(puVar32[uVar20] & 0xfffffffffffffffe);
            if ((pbVar31 == (byte *)0x0) || ((*pbVar31 & 1) == 0)) {
              pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                   (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                   ((byte)pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 0xfe);
              *(byte *)puVar32 = (byte)*puVar32 | 1;
              pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                   (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                   ((byte)pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
              goto LAB_00120ebc;
            }
          }
          else {
            pbVar31 = (byte *)(puVar32[uVar20] & 0xfffffffffffffffe);
          }
          pJStack_80 = (JitAllocatorPool *)
                       (ulong)(pJVar13 == *(JitAllocatorBlock **)&pJVar17->field_0x8);
          if ((pbVar31 == (byte *)0x0) || ((*pbVar31 & 1) == 0)) {
            puVar24 = (ulong *)(*(ulong *)(&pJVar17->
                                            super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                          (long)pJStack_80 * 8) & 0xfffffffffffffffe);
            if ((pbVar25 != (byte *)0x0) && ((*pbVar25 & 1) != 0)) {
              puVar22 = puVar32 + uVar20;
              uVar16 = (ulong)pbVar31 |
                       (ulong)((uint)*(ulong *)(&pJVar13->
                                                 super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                               + uVar18 * 8) & 1);
              puVar24 = puVar32;
              goto LAB_00120e6c;
            }
          }
          else {
            uStack_90 = (ulong)(uVar20 != 0);
            puVar24 = (ulong *)(puVar32[uStack_90] & 0xfffffffffffffffe);
            uVar19 = (ulong)((uint)(uVar20 == 0) * 8);
            puVar32[uStack_90] =
                 (ulong)((uint)puVar32[uStack_90] & 1) |
                 *(ulong *)((long)puVar24 + uVar19) & 0xfffffffffffffffe;
            *(ulong *)((long)puVar24 + uVar19) =
                 (ulong)((uint)*(undefined8 *)((long)puVar24 + uVar19) & 1) | (ulong)puVar32;
            *(byte *)puVar32 = (byte)*puVar32 | 1;
            *(byte *)puVar24 = (byte)*puVar24 & 0xfe;
            uVar16 = (ulong)((uint)*(undefined8 *)
                                    (&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                    + uVar19) & 1);
            *(byte **)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar19) =
                 (byte *)(uVar16 + (long)puVar24);
            puVar22 = puVar24 + uVar20;
            uVar16 = *puVar22 & 0xfffffffffffffffe | uVar16;
LAB_00120e6c:
            *(ulong *)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar18 * 8)
                 = uVar16;
            *puVar22 = (ulong)((uint)*puVar22 & 1) | (ulong)pJVar13;
            pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                 (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                 ((byte)pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
            *(byte *)puVar24 = (byte)*puVar24 & 0xfe;
            *(ulong *)(&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                      (long)pJStack_80 * 8) =
                 (ulong)((uint)*(undefined8 *)
                                (&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                (long)pJStack_80 * 8) & 1) | (ulong)puVar24;
          }
          pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
               (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
               ((byte)pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
          uVar20 = *puVar24;
          *puVar24 = uVar20 | 1;
          pbVar25 = (byte *)(uVar20 & 0xfffffffffffffffe);
          *pbVar25 = *pbVar25 & 0xfe;
          *(ulong *)puVar24[1] = *(ulong *)puVar24[1] & 0xfffffffffffffffe;
        }
      }
      else {
        *(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar18 * 8) =
             (ulong)((uint)*(ulong *)(&pJVar15->
                                       super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                     uVar18 * 8) & 1) |
             *(ulong *)(&pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar28 * 8
                       ) & 0xfffffffffffffffe;
        *(ulong *)(&pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar28 * 8) =
             (ulong)((uint)*(undefined8 *)
                            (&pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                            uVar28 * 8) & 1) | (ulong)pJVar15;
        pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
             (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
             ((byte)pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
        pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
             (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
             ((byte)pJVar21->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 0xfe);
        *pEVar30 = (Environment)((ulong)(SUB84(*pEVar30,0) & 1) | (ulong)pJVar21);
        pJVar13 = pJVar21;
      }
    }
LAB_00120ebc:
    pEVar30 = (Environment *)
              (&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar28 * 8);
    this_00 = *pEVar30;
    uVar20 = uVar28;
    pJVar17 = pJVar13;
  } while (1 < (ulong)this_00);
  if (pJVar11 == (JitAllocatorBlock *)0x0) goto LAB_00120fe2;
  if (pJVar11 == (JitAllocatorBlock *)&uStack_a0) {
LAB_00120fd3:
    remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
    this_00 = EVar23;
LAB_00120fd8:
    remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  else {
    this_00 = (Environment)&uStack_a0;
    if ((JitAllocatorBlock *)&uStack_a0 == pJVar15) goto LAB_00120fd8;
    uVar20 = (ulong)(pJVar15 == *(JitAllocatorBlock **)&pJVar13->field_0x8);
    *(ulong *)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8) =
         (ulong)((uint)*(undefined8 *)
                        (&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                        uVar20 * 8) & 1) |
         *(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                   (ulong)(*(ulong *)pJVar15 < 2) * 8) & 0xfffffffffffffffe;
    if (pJVar11 == pJVar15) {
LAB_00120faa:
      *pEStack_88 = EStack_98;
      if (EStack_98 != (Environment)0x0) {
        *(byte *)EStack_98 = *(byte *)EStack_98 & 0xfe;
      }
      return;
    }
    this_00 = (Environment)&uStack_a0;
    if (pJVar11 != pJVar14) {
      pJVar17 = pJVar14;
      if (pJVar14 == (JitAllocatorBlock *)0x0) {
        pJVar17 = (JitAllocatorBlock *)&uStack_a0;
      }
      if (pJVar17 == (JitAllocatorBlock *)&uStack_a0) {
        uVar20 = 1;
      }
      else {
        pJVar13 = (JitAllocatorBlock *)&uStack_a0;
        if (pJVar14 != (JitAllocatorBlock *)0x0) {
          pJVar13 = pJVar14;
        }
        uVar20 = (ulong)((pJVar13->_mapping).rx < (node->_mapping).rx);
      }
      EVar23 = *(Environment *)
                (&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8);
      while (pJVar14 = (JitAllocatorBlock *)((ulong)EVar23 & 0xfffffffffffffffe), pJVar11 != pJVar14
            ) {
        if (pJVar14 == (JitAllocatorBlock *)0x0) {
          remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
          goto LAB_00120fd3;
        }
        uVar20 = (ulong)((pJVar14->_mapping).rx < (node->_mapping).rx);
        pJVar17 = pJVar14;
        EVar23 = *(Environment *)
                  (&pJVar14->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8);
      }
      *(ulong *)(&pJVar17->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20 * 8) =
           (ulong)(EVar23._0_4_ & 1) | (ulong)pJVar15;
      uVar9 = *(undefined7 *)&pJVar11->field_0x1;
      pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
           pJVar11->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>;
      *(undefined7 *)&pJVar15->field_0x1 = uVar9;
      *(undefined8 *)&pJVar15->field_0x8 = *(undefined8 *)&pJVar11->field_0x8;
      goto LAB_00120faa;
    }
  }
  remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_00120fe2:
  remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  uVar29 = (uint)node;
  if (uVar29 == 0) {
    JitAllocatorBlock::markShrunkArea();
  }
  else {
    uVar26 = extraout_EDX - uVar29;
    uVar20 = (ulong)uVar26;
    if (uVar26 != 0) {
      uVar2 = *(uint *)((long)this_00 + 0x40);
      plVar1 = (long *)(*(long *)((long)this_00 + 0x20) + 0x30 + (ulong)(uVar2 & 8));
      *plVar1 = *plVar1 - uVar20;
      *(uint *)((long)this_00 + 0x48) = *(int *)((long)this_00 + 0x48) - uVar26;
      uVar26 = *(uint *)((long)this_00 + 0x54);
      uVar10 = *(uint *)((long)this_00 + 0x50);
      if (uVar29 <= *(uint *)((long)this_00 + 0x50)) {
        uVar10 = uVar29;
      }
      if (uVar26 <= extraout_EDX) {
        uVar26 = extraout_EDX;
      }
      *(uint *)((long)this_00 + 0x50) = uVar10;
      *(uint *)((long)this_00 + 0x54) = uVar26;
      lVar27 = *(long *)((long)this_00 + 0x58);
      uVar28 = ((ulong)node & 0xffffffff) >> 6;
      uVar18 = 0x40 - (ulong)(uVar29 & 0x3f);
      if (uVar20 <= uVar18) {
        uVar18 = uVar20;
      }
      puVar32 = (ulong *)(lVar27 + uVar28 * 8);
      puVar24 = puVar32 + 1;
      *puVar32 = *puVar32 &
                 ~((0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU)) << (sbyte)(uVar29 & 0x3f));
      uVar16 = uVar20 - uVar18;
      if (0x3f < uVar16) {
        uVar18 = (uVar20 - uVar18) - 0x40;
        uVar20 = uVar18 >> 6;
        memset(puVar24,0,uVar20 * 8 + 8);
        uVar16 = (ulong)((uint)uVar18 & 0x3f);
        puVar24 = (ulong *)(lVar27 + uVar28 * 8 + uVar20 * 8 + 0x10);
      }
      if (uVar16 != 0) {
        *puVar24 = *puVar24 & ~(0xffffffffffffffffU >> (-(char)uVar16 & 0x3fU));
      }
      lVar27 = *(long *)((long)this_00 + 0x60);
      bVar5 = (byte)(extraout_EDX - 1) & 0x3f;
      puVar32 = (ulong *)(lVar27 + (ulong)(extraout_EDX - 1 >> 6) * 8);
      *puVar32 = *puVar32 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      puVar32 = (ulong *)(lVar27 + (ulong)(uVar29 - 1 >> 6) * 8);
      *puVar32 = *puVar32 | 1L << ((byte)(uVar29 - 1) & 0x3f);
      *(uint *)((long)this_00 + 0x40) = uVar2 | 4;
      return;
    }
  }
  JitAllocatorBlock::markShrunkArea();
  Target::Target((Target *)this_00);
  *(undefined ***)this_00 = &PTR__JitRuntime_00173340;
  JitAllocator::JitAllocator((JitAllocator *)((long)this_00 + 0x30),(CreateParams *)node);
  *(undefined8 *)((long)this_00 + 8) = 0x10203000002;
  pCVar12 = CpuInfo::host();
  uVar6 = *(undefined8 *)(pCVar12 + 0x80);
  uVar7 = *(undefined8 *)(pCVar12 + 0x88);
  uVar8 = *(undefined8 *)(pCVar12 + 0x90);
  *(undefined8 *)((long)this_00 + 0x10) = *(undefined8 *)(pCVar12 + 0x78);
  *(undefined8 *)((long)this_00 + 0x18) = uVar6;
  *(undefined8 *)((long)this_00 + 0x20) = uVar7;
  *(undefined8 *)((long)this_00 + 0x28) = uVar8;
  return;
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }